

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# diagonal_precond.cc
# Opt level: O2

void __thiscall
ipx::DiagonalPrecond::_Apply(DiagonalPrecond *this,Vector *rhs,Vector *lhs,double *rhs_dot_lhs)

{
  uint uVar1;
  double *pdVar2;
  double *pdVar3;
  double *pdVar4;
  ulong uVar5;
  ulong uVar6;
  double dVar7;
  double dVar8;
  Timer timer;
  Timer local_30;
  
  uVar1 = this->model_->num_rows_;
  Timer::Timer(&local_30);
  pdVar2 = rhs->_M_data;
  pdVar3 = (this->diagonal_)._M_data;
  pdVar4 = lhs->_M_data;
  uVar5 = 0;
  uVar6 = (ulong)uVar1;
  if ((int)uVar1 < 1) {
    uVar6 = uVar5;
  }
  dVar7 = 0.0;
  for (; uVar6 != uVar5; uVar5 = uVar5 + 1) {
    dVar8 = pdVar2[uVar5] / pdVar3[uVar5];
    pdVar4[uVar5] = dVar8;
    dVar7 = dVar7 + dVar8 * pdVar2[uVar5];
  }
  if (rhs_dot_lhs != (double *)0x0) {
    *rhs_dot_lhs = dVar7;
  }
  dVar7 = Timer::Elapsed(&local_30);
  this->time_ = dVar7 + this->time_;
  return;
}

Assistant:

void DiagonalPrecond::_Apply(const Vector& rhs, Vector& lhs,
                              double* rhs_dot_lhs) {
    const Int m = model_.rows();
    double rldot = 0.0;
    Timer timer;

    assert(factorized_);
    assert(lhs.size() == static_cast<size_t>(m));
    assert(rhs.size() == static_cast<size_t>(m));

    for (Int i = 0; i < m; i++) {
        lhs[i] = rhs[i] / diagonal_[i];
        rldot += lhs[i] * rhs[i];
    }
    if (rhs_dot_lhs)
        *rhs_dot_lhs = rldot;
    time_ += timer.Elapsed();
}